

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_definition
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  t_field *tfield;
  t_struct *ptVar1;
  t_struct *out_00;
  bool bVar2;
  ostream *poVar3;
  t_const_value *ptVar4;
  t_type *ptVar5;
  reference pptVar6;
  string *psVar7;
  char *pcVar8;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_680
  ;
  t_field **local_678;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_5f0
  ;
  t_field **local_5e8;
  byte local_5d9;
  undefined1 local_5d8 [7];
  bool first;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  t_type *local_4b8;
  t_type *t;
  t_field **local_4a8;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  undefined1 local_339;
  const_iterator cStack_338;
  bool is_required_2;
  t_field **local_330;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_241;
  const_iterator cStack_240;
  bool is_required_1;
  t_field **local_238;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  byte local_18a;
  undefined1 local_189;
  bool generate_isset;
  const_iterator cStack_188;
  bool is_required;
  t_field **local_180;
  byte local_173;
  byte local_172;
  allocator local_171;
  undefined1 local_170 [5];
  bool has_required_fields;
  bool has_non_required_fields;
  string local_150;
  string local_130;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_110
  ;
  t_field **local_108;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_100
  ;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_d0;
  undefined1 local_b0 [8];
  string sharp_struct_name;
  allocator local_81;
  key_type local_80;
  _Self local_60;
  byte local_55;
  bool is_final;
  string local_48;
  byte local_23;
  byte local_22;
  byte local_21;
  bool is_result_local;
  bool in_class_local;
  t_struct *ptStack_20;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_23 = is_result;
  local_22 = in_class;
  local_21 = is_exception;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  if (!in_class) {
    start_netstd_namespace(this,out);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  generate_netstd_doc(this,(ostream *)tstruct_local,(t_doc *)ptStack_20);
  collect_extensions_types(this,ptStack_20);
  prepare_member_name_mapping(this,ptStack_20);
  bVar2 = is_serialize_enabled(this);
  if (((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) &&
     (ptVar1 = tstruct_local, (local_21 & 1) == 0)) {
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_48);
    poVar3 = std::operator<<(poVar3,"[DataContract(Namespace=\"");
    poVar3 = std::operator<<(poVar3,(string *)&this->wcf_namespace_);
    poVar3 = std::operator<<(poVar3,"\")]");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ptVar5 = &ptStack_20->super_t_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"final",&local_81);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&ptVar5->annotations_,&local_80);
  sharp_struct_name.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(ptStack_20->super_t_type).annotations_);
  bVar2 = std::operator!=(&local_60,(_Self *)((long)&sharp_struct_name.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_55 = bVar2;
  type_name_abi_cxx11_((string *)local_b0,this,&ptStack_20->super_t_type,false);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_d0);
  poVar3 = std::operator<<(poVar3,"public ");
  pcVar8 = "";
  if ((local_55 & 1) != 0) {
    pcVar8 = "sealed ";
  }
  poVar3 = std::operator<<(poVar3,pcVar8);
  poVar3 = std::operator<<(poVar3,"partial class ");
  poVar3 = std::operator<<(poVar3,(string *)local_b0);
  std::operator<<(poVar3," : ");
  std::__cxx11::string::~string((string *)&local_d0);
  if ((local_21 & 1) != 0) {
    std::operator<<((ostream *)tstruct_local,"TException, ");
  }
  poVar3 = std::operator<<((ostream *)tstruct_local,"TBase");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&members,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&members);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&members);
  t_generator::indent_up((t_generator *)this);
  m_iter._M_current = (t_field **)t_struct::get_members(ptStack_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_100);
  local_108 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_100._M_current = local_108;
  while( true ) {
    local_110._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_100,&local_110);
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    bVar2 = field_is_required(*pptVar6);
    ptVar1 = tstruct_local;
    if (!bVar2) {
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_130);
      poVar3 = std::operator<<(poVar3,"private ");
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      tfield = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_170,"_",&local_171);
      declare_field(&local_150,this,tfield,false,(string *)local_170);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string((string *)&local_130);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  local_172 = 0;
  local_173 = 0;
  local_180 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_100._M_current = local_180;
  while( true ) {
    cStack_188 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_100,&stack0xfffffffffffffe78);
    ptVar1 = tstruct_local;
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    generate_netstd_doc(this,(ostream *)ptVar1,*pptVar6);
    ptVar1 = tstruct_local;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    generate_property(this,(ostream *)ptVar1,*pptVar6,true,true);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    local_189 = field_is_required(*pptVar6);
    if ((bool)local_189) {
      local_173 = 1;
    }
    else {
      local_172 = 1;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  local_18a = local_172 & 1;
  if (local_18a != 0) {
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    bVar2 = is_serialize_enabled(this);
    if ((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) {
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_1b0);
      poVar3 = std::operator<<(poVar3,"[DataMember(Order = 1)]");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_1d0);
    poVar3 = std::operator<<(poVar3,"public Isset __isset;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d0);
    bVar2 = is_serialize_enabled(this);
    if ((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) {
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_1f0);
      poVar3 = std::operator<<(poVar3,"[DataContract]");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_210);
    poVar3 = std::operator<<(poVar3,"public struct Isset");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_230);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    t_generator::indent_up((t_generator *)this);
    local_238 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_100._M_current = local_238;
    while( true ) {
      cStack_240 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_100,&stack0xfffffffffffffdc0);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      local_241 = field_is_required(*pptVar6);
      if (!(bool)local_241) {
        bVar2 = is_serialize_enabled(this);
        if ((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) {
          ptVar1 = tstruct_local;
          t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_268);
          poVar3 = std::operator<<(poVar3,"[DataMember]");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_268);
        }
        ptVar1 = tstruct_local;
        t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_288);
        poVar3 = std::operator<<(poVar3,"public bool ");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::__cxx11::string::string((string *)&local_2e8,(string *)psVar7);
        normalize_name(&local_2c8,this,&local_2e8,false);
        get_isset_name(&local_2a8,this,&local_2c8);
        poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
        poVar3 = std::operator<<(poVar3,";");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_288);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_100);
    }
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_308,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_308);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_308);
    if (((local_18a & 1) != 0) &&
       ((bVar2 = is_serialize_enabled(this), bVar2 || (bVar2 = is_wcf_enabled(this), bVar2)))) {
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_328,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_328);
      poVar3 = std::operator<<(poVar3,"#region XmlSerializer support");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_328);
      local_330 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_100._M_current = local_330;
      while( true ) {
        cStack_338 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_100,&stack0xfffffffffffffcc8);
        ptVar1 = tstruct_local;
        if (!bVar2) break;
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        local_339 = field_is_required(*pptVar6);
        ptVar1 = tstruct_local;
        if (!(bool)local_339) {
          t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_360);
          poVar3 = std::operator<<(poVar3,"public bool ShouldSerialize");
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_100);
          prop_name_abi_cxx11_(&local_380,this,*pptVar6,false);
          poVar3 = std::operator<<(poVar3,(string *)&local_380);
          poVar3 = std::operator<<(poVar3,"()");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
          poVar3 = std::operator<<(poVar3,(string *)&local_3a0);
          poVar3 = std::operator<<(poVar3,"{");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_360);
          t_generator::indent_up((t_generator *)this);
          ptVar1 = tstruct_local;
          t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_3c0);
          poVar3 = std::operator<<(poVar3,"return __isset.");
          pptVar6 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_100);
          psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
          std::__cxx11::string::string((string *)&local_420,(string *)psVar7);
          normalize_name(&local_400,this,&local_420,false);
          get_isset_name(&local_3e0,this,&local_400);
          poVar3 = std::operator<<(poVar3,(string *)&local_3e0);
          poVar3 = std::operator<<(poVar3,";");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
          std::__cxx11::string::~string((string *)&local_3c0);
          t_generator::indent_down((t_generator *)this);
          ptVar1 = tstruct_local;
          t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
          poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_440);
          poVar3 = std::operator<<(poVar3,"}");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_440);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_100);
      }
      t_generator::indent_abi_cxx11_(&local_460,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_460);
      poVar3 = std::operator<<(poVar3,"#endregion XmlSerializer support");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_460);
    }
  }
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_480,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_480);
  poVar3 = std::operator<<(poVar3,"public ");
  poVar3 = std::operator<<(poVar3,(string *)local_b0);
  poVar3 = std::operator<<(poVar3,"()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4a0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_4a0);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  t_generator::indent_up((t_generator *)this);
  local_4a8 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_100._M_current = local_4a8;
  while( true ) {
    t = (t_type *)
        std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_100,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&t);
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    local_4b8 = t_field::get_type(*pptVar6);
    local_4b8 = resolve_typedef(local_4b8);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    ptVar4 = t_field::get_value(*pptVar6);
    if (ptVar4 != (t_const_value *)0x0) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      bVar2 = field_is_required(*pptVar6);
      ptVar1 = tstruct_local;
      if (bVar2) {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        prop_name_abi_cxx11_(&local_4f8,this,*pptVar6,false);
        std::operator+(&local_4d8,"this.",&local_4f8);
        ptVar5 = local_4b8;
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        ptVar4 = t_field::get_value(*pptVar6);
        print_const_value(this,(ostream *)ptVar1,&local_4d8,ptVar5,ptVar4,true,true,false);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_4f8);
      }
      else {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::operator+(&local_518,"this._",psVar7);
        ptVar5 = local_4b8;
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        ptVar4 = t_field::get_value(*pptVar6);
        print_const_value(this,(ostream *)ptVar1,&local_518,ptVar5,ptVar4,true,true,false);
        std::__cxx11::string::~string((string *)&local_518);
        ptVar1 = tstruct_local;
        t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_538);
        poVar3 = std::operator<<(poVar3,"this.__isset.");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::__cxx11::string::string((string *)&local_598,(string *)psVar7);
        normalize_name(&local_578,this,&local_598,false);
        get_isset_name(&local_558,this,&local_578);
        poVar3 = std::operator<<(poVar3,(string *)&local_558);
        poVar3 = std::operator<<(poVar3," = true;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_538);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_5b8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_5b8);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5b8);
  ptVar1 = tstruct_local;
  if ((local_173 & 1) != 0) {
    t_generator::indent_abi_cxx11_((string *)local_5d8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)local_5d8);
    poVar3 = std::operator<<(poVar3,"public ");
    poVar3 = std::operator<<(poVar3,(string *)local_b0);
    std::operator<<(poVar3,"(");
    std::__cxx11::string::~string((string *)local_5d8);
    local_5d9 = 1;
    local_5e8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_100._M_current = local_5e8;
    while( true ) {
      local_5f0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_100,&local_5f0);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      bVar2 = field_is_required(*pptVar6);
      if (bVar2) {
        if ((local_5d9 & 1) == 0) {
          std::operator<<((ostream *)tstruct_local,", ");
        }
        else {
          local_5d9 = 0;
        }
        ptVar1 = tstruct_local;
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        ptVar5 = t_field::get_type(*pptVar6);
        type_name_abi_cxx11_(&local_610,this,ptVar5,true);
        poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_610);
        poVar3 = std::operator<<(poVar3," ");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::__cxx11::string::string((string *)&local_650,(string *)psVar7);
        normalize_name(&local_630,this,&local_650,false);
        std::operator<<(poVar3,(string *)&local_630);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&local_610);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_100);
    }
    poVar3 = std::operator<<((ostream *)tstruct_local,") : this()");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_670,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_670);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_670);
    t_generator::indent_up((t_generator *)this);
    local_678 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_100._M_current = local_678;
    while( true ) {
      local_680._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_100,&local_680);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      bVar2 = field_is_required(*pptVar6);
      ptVar1 = tstruct_local;
      if (bVar2) {
        t_generator::indent_abi_cxx11_(&local_6a0,(t_generator *)this);
        poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_6a0);
        poVar3 = std::operator<<(poVar3,"this.");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        prop_name_abi_cxx11_(&local_6c0,this,*pptVar6,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_6c0);
        poVar3 = std::operator<<(poVar3," = ");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_100);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::__cxx11::string::string((string *)&local_700,(string *)psVar7);
        normalize_name(&local_6e0,this,&local_700,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_6e0);
        poVar3 = std::operator<<(poVar3,";");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_6e0);
        std::__cxx11::string::~string((string *)&local_700);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6a0);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_100);
    }
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_720,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_720);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_720);
  }
  out_00 = tstruct_local;
  ptVar1 = ptStack_20;
  std::__cxx11::string::string((string *)&local_740,(string *)local_b0);
  generate_netstd_deepcopy_method(this,(ostream *)out_00,ptVar1,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  generate_netstd_struct_reader(this,(ostream *)tstruct_local,ptStack_20);
  if ((local_23 & 1) == 0) {
    generate_netstd_struct_writer(this,(ostream *)tstruct_local,ptStack_20);
  }
  else {
    generate_netstd_struct_result_writer(this,(ostream *)tstruct_local,ptStack_20);
  }
  generate_netstd_struct_equals(this,(ostream *)tstruct_local,ptStack_20);
  generate_netstd_struct_hashcode(this,(ostream *)tstruct_local,ptStack_20);
  generate_netstd_struct_tostring(this,(ostream *)tstruct_local,ptStack_20);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_760,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_760);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_760);
  bVar2 = is_serialize_enabled(this);
  if (((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) && ((local_21 & 1) != 0)) {
    generate_netstd_wcffault(this,(ostream *)tstruct_local,ptStack_20);
  }
  cleanup_member_name_mapping(this,ptStack_20);
  if ((local_22 & 1) == 0) {
    end_netstd_namespace(this,(ostream *)tstruct_local);
  }
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_definition(ostream& out, t_struct* tstruct, bool is_exception, bool in_class, bool is_result)
{
    if (!in_class)
    {
        start_netstd_namespace(out);
    }

    out << endl;

    generate_netstd_doc(out, tstruct);
    collect_extensions_types(tstruct);
    prepare_member_name_mapping(tstruct);

    if ((is_serialize_enabled() || is_wcf_enabled()) && !is_exception)
    {
        out << indent() << "[DataContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    bool is_final = tstruct->annotations_.find("final") != tstruct->annotations_.end();

    string sharp_struct_name = type_name(tstruct, false);

    out << indent() << "public " << (is_final ? "sealed " : "") << "partial class " << sharp_struct_name << " : ";

    if (is_exception)
    {
        out << "TException, ";
    }

    out << "TBase" << endl
        << indent() << "{" << endl;
    indent_up();

    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;

    // make private members with public Properties
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        // if the field is required, then we use auto-properties
        if (!field_is_required((*m_iter)))
        {
            out << indent() << "private " << declare_field(*m_iter, false, "_") << endl;
        }
    }
    out << endl;

    bool has_non_required_fields = false;
    bool has_required_fields = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        generate_netstd_doc(out, *m_iter);
        generate_property(out, *m_iter, true, true);
        bool is_required = field_is_required((*m_iter));
        if (is_required)
        {
            has_required_fields = true;
    }
        else
        {
            has_non_required_fields = true;
        }
    }

    bool generate_isset = has_non_required_fields;
    if (generate_isset)
    {
        out << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataMember(Order = 1)]" << endl;
        }
        out << indent() << "public Isset __isset;" << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataContract]" << endl;
        }

        out << indent() << "public struct Isset" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            bool is_required = field_is_required((*m_iter));
            // if it is required, don't need Isset for that variable
            // if it is not required, if it has a default value, we need to generate Isset
            if (!is_required)
            {
                if (is_serialize_enabled() || is_wcf_enabled())
                {
                    out << indent() << "[DataMember]" << endl;
                }
                out << indent() << "public bool " << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;

        if (generate_isset && (is_serialize_enabled() || is_wcf_enabled()))
        {
            out << indent() << "#region XmlSerializer support" << endl << endl;

            for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
            {
                bool is_required = field_is_required(*m_iter);
                // if it is required, don't need Isset for that variable
                // if it is not required, if it has a default value, we need to generate Isset
                if (!is_required)
                {
                    out << indent() << "public bool ShouldSerialize" << prop_name(*m_iter) << "()" << endl
                        << indent() << "{" << endl;
                    indent_up();
                    out << indent() << "return __isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
                    indent_down();
                    out << indent() << "}" << endl << endl;
                }
            }

            out << indent() << "#endregion XmlSerializer support" << endl << endl;
        }
    }

    // We always want a default, no argument constructor for Reading
    out << indent() << "public " << sharp_struct_name << "()" << endl
        << indent() << "{" << endl;
    indent_up();

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        t_type* t = (*m_iter)->get_type();
        t = resolve_typedef(t);

        if ((*m_iter)->get_value() != nullptr)
        {
            if (field_is_required((*m_iter)))
            {
                print_const_value(out, "this." + prop_name(*m_iter), t, (*m_iter)->get_value(), true, true);
            }
            else
            {
                print_const_value(out, "this._" + (*m_iter)->get_name(), t, (*m_iter)->get_value(), true, true);
                // Optionals with defaults are marked set
                out << indent() << "this.__isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << " = true;" << endl;
            }
        }
    }
    indent_down();
    out << indent() << "}" << endl << endl;

    // if we have required fields, we add that CTOR too
    if (has_required_fields)
    {
        out << indent() << "public " << sharp_struct_name << "(";
        bool first = true;
        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                if (first)
                {
                    first = false;
                }
                else
                {
                    out << ", ";
                }
                out << type_name((*m_iter)->get_type()) << " " << normalize_name((*m_iter)->get_name());
            }
        }
        out << ") : this()" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                out << indent() << "this." << prop_name(*m_iter) << " = " << normalize_name((*m_iter)->get_name()) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;
    }

    // DeepCopy()
    generate_netstd_deepcopy_method(out, tstruct, sharp_struct_name);

    generate_netstd_struct_reader(out, tstruct);
    if (is_result)
    {
        generate_netstd_struct_result_writer(out, tstruct);
    }
    else
    {
        generate_netstd_struct_writer(out, tstruct);
    }
    generate_netstd_struct_equals(out, tstruct);
    generate_netstd_struct_hashcode(out, tstruct);
    generate_netstd_struct_tostring(out, tstruct);

    indent_down();
    out << indent() << "}" << endl << endl;

    // generate a corresponding WCF fault to wrap the exception
    if ((is_serialize_enabled() || is_wcf_enabled()) && is_exception)
    {
        generate_netstd_wcffault(out, tstruct);
    }

    cleanup_member_name_mapping(tstruct);
    if (!in_class)
    {
        end_netstd_namespace(out);
    }
}